

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.cpp
# Opt level: O0

void __thiscall
helics::apps::PhasorGenerator::set(PhasorGenerator *this,string_view parameter,double val)

{
  string_view sVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_10;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  bool bVar2;
  complex<double> *in_RDX;
  size_t in_RSI;
  SignalGenerator *in_RDI;
  _func_int **in_XMM0_Qa;
  double *in_stack_fffffffffffffe38;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe40;
  size_t in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  complex<double> *__z;
  complex<double> *in_stack_fffffffffffffe80;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
  __x._M_str = in_stack_fffffffffffffe60;
  __x._M_len = in_stack_fffffffffffffe58;
  __y._M_str = in_stack_fffffffffffffe50;
  __y._M_len = in_stack_fffffffffffffe48;
  bVar2 = std::operator==(__x,__y);
  if (!bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
    __x_00._M_str = in_stack_fffffffffffffe60;
    __x_00._M_len = in_stack_fffffffffffffe58;
    __y_00._M_str = in_stack_fffffffffffffe50;
    __y_00._M_len = in_stack_fffffffffffffe48;
    bVar2 = std::operator==(__x_00,__y_00);
    if (!bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
      __x_01._M_str = in_stack_fffffffffffffe60;
      __x_01._M_len = in_stack_fffffffffffffe58;
      __y_01._M_str = in_stack_fffffffffffffe50;
      __y_01._M_len = in_stack_fffffffffffffe48;
      bVar2 = std::operator==(__x_01,__y_01);
      if (!bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
        __x_02._M_str = in_stack_fffffffffffffe60;
        __x_02._M_len = in_stack_fffffffffffffe58;
        __y_02._M_str = in_stack_fffffffffffffe50;
        __y_02._M_len = in_stack_fffffffffffffe48;
        bVar2 = std::operator==(__x_02,__y_02);
        if (bVar2) {
          in_RDI[1].keyTime.internalTimeCode = (baseType)(1.0 / (double)in_XMM0_Qa);
          return;
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
        __x_03._M_str = in_stack_fffffffffffffe60;
        __x_03._M_len = in_stack_fffffffffffffe58;
        __y_03._M_str = in_stack_fffffffffffffe50;
        __y_03._M_len = in_stack_fffffffffffffe48;
        bVar2 = std::operator==(__x_03,__y_03);
        if (bVar2) {
          *(_func_int ***)((long)&in_RDI[1].mName.field_2 + 8) = in_XMM0_Qa;
          return;
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
        __x_04._M_str = in_stack_fffffffffffffe60;
        __x_04._M_len = in_stack_fffffffffffffe58;
        __y_04._M_str = in_stack_fffffffffffffe50;
        __y_04._M_len = in_stack_fffffffffffffe48;
        bVar2 = std::operator==(__x_04,__y_04);
        if (bVar2) {
          *(_func_int ***)&in_RDI[1].mName.field_2 = in_XMM0_Qa;
          return;
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
        __x_05._M_str = in_stack_fffffffffffffe60;
        __x_05._M_len = in_stack_fffffffffffffe58;
        __y_05._M_str = in_stack_fffffffffffffe50;
        __y_05._M_len = in_stack_fffffffffffffe48;
        bVar2 = std::operator==(__x_05,__y_05);
        if (!bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
          __x_06._M_str = in_stack_fffffffffffffe60;
          __x_06._M_len = in_stack_fffffffffffffe58;
          __y_06._M_str = in_stack_fffffffffffffe50;
          __y_06._M_len = in_stack_fffffffffffffe48;
          bVar2 = std::operator==(__x_06,__y_06);
          if (!bVar2) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
            __x_07._M_str = in_stack_fffffffffffffe60;
            __x_07._M_len = in_stack_fffffffffffffe58;
            __y_07._M_str = in_stack_fffffffffffffe50;
            __y_07._M_len = in_stack_fffffffffffffe48;
            bVar2 = std::operator==(__x_07,__y_07);
            if (!bVar2) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
              __x_08._M_str = in_stack_fffffffffffffe60;
              __x_08._M_len = in_stack_fffffffffffffe58;
              __y_08._M_str = in_stack_fffffffffffffe50;
              __y_08._M_len = in_stack_fffffffffffffe48;
              bVar2 = std::operator==(__x_08,__y_08);
              if (bVar2) {
                in_RDI[1]._vptr_SignalGenerator = in_XMM0_Qa;
                return;
              }
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
              __x_09._M_str = in_stack_fffffffffffffe60;
              __x_09._M_len = in_stack_fffffffffffffe58;
              __y_09._M_str = in_stack_fffffffffffffe50;
              __y_09._M_len = in_stack_fffffffffffffe48;
              bVar2 = std::operator==(__x_09,__y_09);
              if (!bVar2) {
                __z = in_RDX;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
                __x_10._M_str = in_stack_fffffffffffffe60;
                __x_10._M_len = in_stack_fffffffffffffe58;
                __y_10._M_str = in_stack_fffffffffffffe50;
                __y_10._M_len = in_stack_fffffffffffffe48;
                bVar2 = std::operator==(__x_10,__y_10);
                if (!bVar2) {
                  sVar1._M_str = (char *)in_RDX;
                  sVar1._M_len = in_RSI;
                  SignalGenerator::set(in_RDI,sVar1,(double)in_XMM0_Qa);
                  return;
                }
                std::polar<double>((double *)
                                   ((double)in_XMM0_Qa - (double)in_RDI[1].mName._M_dataplus._M_p),
                                   in_stack_fffffffffffffe38);
                std::complex<double>::operator*=(in_stack_fffffffffffffe80,__z);
                in_RDI[1].mName._M_dataplus._M_p = (pointer)in_XMM0_Qa;
                return;
              }
              in_RDI[1].lastTime.internalTimeCode = (baseType)in_XMM0_Qa;
              return;
            }
          }
        }
        in_RDI[1].mName._M_string_length = (size_type)in_XMM0_Qa;
        return;
      }
    }
  }
  in_RDI[1].keyTime.internalTimeCode = (baseType)in_XMM0_Qa;
  return;
}

Assistant:

void PhasorGenerator::set(std::string_view parameter, double val)
    {
        if ((parameter == "frequency") || (parameter == "freq") || (parameter == "f")) {
            frequency = val;
        } else if (parameter == "period") {
            frequency = 1.0 / val;
        } else if (parameter == "dfdt") {
            dfdt = val;
        } else if (parameter == "dadt") {
            dAdt = val;
        } else if ((parameter == "amplitude") || (parameter == "amp") || (parameter == "a")) {
            amplitude = val;
        } else if (parameter == "bias_real") {
            bias_real = val;
        } else if (parameter == "bias_imag") {
            bias_imag = val;
        } else if (parameter == "offset") {
            state *= std::polar(1.0, (val - offset));
            offset = val;
        } else {
            SignalGenerator::set(parameter, val);
        }
    }